

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::BufferWriteTests::init(BufferWriteTests *this,EVP_PKEY_CTX *ctx)

{
  ulong uVar1;
  deUint32 dVar2;
  VerifyType VVar3;
  Context *pCVar4;
  deUint32 dVar5;
  uint uVar6;
  TestNode *pTVar7;
  char *pcVar8;
  int (*paiVar9) [2];
  long *plVar10;
  BufferCase *pBVar11;
  TestNode *node;
  RecreateBufferDataStoreCase *pRVar12;
  DataStoreSpec *specs;
  SubDataToUndefinedCase *pSVar13;
  int extraout_RAX [2];
  int aiVar14 [2];
  size_type *psVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  deUint32 target;
  iterator spec;
  DataStoreSpec *pDVar19;
  long lVar20;
  undefined1 local_250 [16];
  long local_240;
  int aiStack_238 [2];
  ulong *local_230;
  int local_228;
  undefined4 uStack_224;
  ulong local_220 [2];
  ulong *local_210;
  int local_208;
  undefined4 uStack_204;
  ulong local_200 [2];
  ulong local_1f0;
  string name;
  ios_base local_178 [272];
  Random rnd;
  DataStoreSpec local_50;
  DataStoreSpec local_44;
  TestNode *local_38;
  
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic upload with glBufferData()");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  lVar20 = 0;
  do {
    dVar5 = init::bufferTargets[lVar20];
    lVar16 = 0;
    local_1f0 = lVar20;
    do {
      dVar2 = *(deUint32 *)((long)init::usageHints + lVar16);
      pcVar8 = BufferTestUtil::getBufferTargetName(dVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,pcVar8,(allocator<char> *)&local_210);
      paiVar9 = (int (*) [2])std::__cxx11::string::append((char *)&local_230);
      local_250._0_8_ = &local_240;
      aiVar14 = (int  [2])(paiVar9 + 2);
      if (*paiVar9 == aiVar14) {
        local_240 = *(long *)aiVar14;
        aiStack_238 = paiVar9[3];
      }
      else {
        local_240 = *(long *)aiVar14;
        local_250._0_8_ = *paiVar9;
      }
      local_250._8_8_ = paiVar9[1];
      *paiVar9 = aiVar14;
      paiVar9[1] = (int  [2])0x0;
      *(undefined1 *)paiVar9[2] = 0;
      BufferTestUtil::getUsageHintName(dVar2);
      plVar10 = (long *)std::__cxx11::string::append(local_250);
      name._M_dataplus._M_p = (pointer)&name.field_2;
      psVar15 = (size_type *)(plVar10 + 2);
      if ((size_type *)*plVar10 == psVar15) {
        name.field_2._M_allocated_capacity = *psVar15;
        name.field_2._8_8_ = plVar10[3];
      }
      else {
        name.field_2._M_allocated_capacity = *psVar15;
        name._M_dataplus._M_p = (pointer)*plVar10;
      }
      name._M_string_length = plVar10[1];
      *plVar10 = (long)psVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((long *)local_250._0_8_ != &local_240) {
        operator_delete((void *)local_250._0_8_,local_240 + 1);
      }
      if (local_230 != local_220) {
        operator_delete(local_230,local_220[0] + 1);
      }
      pBVar11 = (BufferCase *)operator_new(0xd0);
      BufferTestUtil::BufferCase::BufferCase
                (pBVar11,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,"");
      (pBVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_0078f1e8;
      *(deUint32 *)&pBVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar5;
      *(deUint32 *)
       ((long)&pBVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) = dVar2;
      pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x3fc;
      tcu::TestNode::addChild(pTVar7,(TestNode *)pBVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar16 = lVar16 + 4;
    } while (lVar16 != 0xc);
    lVar20 = local_1f0 + 1;
  } while (local_1f0 == 0);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"use",
             "Buffer uses");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  lVar20 = 0;
  do {
    node = (TestNode *)operator_new(0x70);
    local_1f0 = lVar20;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::verifyTypes[lVar20].name,"");
    tcu::TestNode::addChild(pTVar7,node);
    VVar3 = init::verifyTypes[lVar20].verify;
    lVar20 = 0;
    do {
      dVar5 = *(deUint32 *)((long)init::bufferTargets + lVar20);
      pcVar8 = BufferTestUtil::getBufferTargetName(dVar5);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&name,pcVar8,(allocator<char> *)local_250);
      pBVar11 = (BufferCase *)operator_new(0xd0);
      BufferTestUtil::BufferCase::BufferCase
                (pBVar11,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,"");
      (pBVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__BufferCase_0078f1e8;
      *(deUint32 *)&pBVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = dVar5;
      *(undefined8 *)
       ((long)&pBVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
           0x2fb000088e4;
      *(VerifyType *)((long)&pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx + 4)
           = VVar3;
      tcu::TestNode::addChild(node,(TestNode *)pBVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)name._M_dataplus._M_p != &name.field_2) {
        operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
      }
      lVar20 = lVar20 + 4;
    } while (lVar20 == 4);
    lVar20 = local_1f0 + 1;
  } while (local_1f0 == 0);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "recreate_store","Data store recreate using glBufferData()");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_250._0_4_ = 0x8892;
  local_250._4_4_ = 0x88e4;
  local_250._8_4_ = 0x3e4;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
  ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
            ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
              *)&name,(iterator)0x0,(DataStoreSpec *)local_250);
  local_230 = (ulong *)0x88e400008892;
  local_228 = 0x3e4;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&local_230);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x3e4;
    *(undefined8 *)name._M_string_length = 0x88e400008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_210 = (ulong *)0x88e400008892;
  local_208 = 0x3e4;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&local_210);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x3e4;
    *(undefined8 *)name._M_string_length = 0x88e400008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  pRVar12 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar12,(this->super_TestCaseGroup).m_context,"identical_1",
             "Recreate with identical parameters",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 2) * -0x55555555,
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar12);
  if (name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(name._M_dataplus._M_p,
                    name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_250._0_4_ = 0x8893;
  local_250._4_4_ = 0x88e4;
  local_250._8_4_ = 0x48;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
  ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
            ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
              *)&name,(iterator)0x0,(DataStoreSpec *)local_250);
  local_230 = (ulong *)0x88e400008893;
  local_228 = 0x48;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&local_230);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x48;
    *(undefined8 *)name._M_string_length = 0x88e400008893;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_210 = (ulong *)0x88e400008893;
  local_208 = 0x48;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&local_210);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x48;
    *(undefined8 *)name._M_string_length = 0x88e400008893;
    name._M_string_length = name._M_string_length + 0xc;
  }
  pRVar12 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar12,(this->super_TestCaseGroup).m_context,"identical_2",
             "Recreate with identical parameters",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 2) * -0x55555555,
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar12);
  if (name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(name._M_dataplus._M_p,
                    name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_250._0_4_ = 0x8892;
  local_250._4_4_ = 0x88e4;
  local_250._8_4_ = 0x1f8;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
  ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
            ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
              *)&name,(iterator)0x0,(DataStoreSpec *)local_250);
  local_230 = (ulong *)0x88e400008893;
  local_228 = 0x1f8;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&local_230);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x1f8;
    *(undefined8 *)name._M_string_length = 0x88e400008893;
    name._M_string_length = name._M_string_length + 0xc;
  }
  pRVar12 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar12,(this->super_TestCaseGroup).m_context,"different_target_1",
             "Recreate with different target",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 2) * -0x55555555,
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar12);
  if (name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(name._M_dataplus._M_p,
                    name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_250._0_4_ = 0x8893;
  local_250._4_4_ = 0x88e4;
  local_250._8_4_ = 0x2cc;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
  ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
            ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
              *)&name,(iterator)0x0,(DataStoreSpec *)local_250);
  local_230 = (ulong *)0x88e400008892;
  local_228 = 0x2cc;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&local_230);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x2cc;
    *(undefined8 *)name._M_string_length = 0x88e400008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_210 = (ulong *)0x88e400008893;
  local_208 = 0x2cc;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&local_210);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x2cc;
    *(undefined8 *)name._M_string_length = 0x88e400008893;
    name._M_string_length = name._M_string_length + 0xc;
  }
  pRVar12 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar12,(this->super_TestCaseGroup).m_context,"different_target_2",
             "Recreate with different target",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 2) * -0x55555555,
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar12);
  if (name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(name._M_dataplus._M_p,
                    name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_250._0_4_ = 0x8892;
  local_250._4_4_ = 0x88e0;
  local_250._8_4_ = 0x66c;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
  ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
            ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
              *)&name,(iterator)0x0,(DataStoreSpec *)local_250);
  local_230 = (ulong *)0x88e800008892;
  local_228 = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&local_230);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88e800008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_210 = (ulong *)0x88e400008892;
  local_208 = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&local_210);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88e400008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  rnd.m_rnd.x = 0x8892;
  rnd.m_rnd.y = 0x88e0;
  rnd.m_rnd.z = 0x66c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&rnd);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x66c;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  pRVar12 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar12,(this->super_TestCaseGroup).m_context,"different_usage",
             "Recreate with different usage",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 2) * -0x55555555,
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar12);
  if (name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(name._M_dataplus._M_p,
                    name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
  }
  name._M_dataplus._M_p = (pointer)0x0;
  name._M_string_length = 0;
  name.field_2._M_allocated_capacity = 0;
  local_250._0_4_ = 0x8892;
  local_250._4_4_ = 0x88e0;
  local_250._8_4_ = 0x400;
  std::
  vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
  ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
            ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
              *)&name,(iterator)0x0,(DataStoreSpec *)local_250);
  local_230 = (ulong *)0x88e000008892;
  local_228 = 0xc;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&local_230);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0xc;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_210 = (ulong *)0x88e000008892;
  local_208 = 0xcff;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&local_210);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0xcff;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  rnd.m_rnd.x = 0x8892;
  rnd.m_rnd.y = 0x88e0;
  rnd.m_rnd.z = 0x5c;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,(DataStoreSpec *)&rnd);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x5c;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_44.target = 0x8892;
  local_44.usage = 0x88e0;
  local_44.size = 0x305b;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_44);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x305b;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  local_50.target = 0x8892;
  local_50.usage = 0x88e0;
  local_50.size = 0x23b;
  if (name._M_string_length == name.field_2._M_allocated_capacity) {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
    ::_M_realloc_insert<deqp::gles2::Functional::DataStoreSpec_const&>
              ((vector<deqp::gles2::Functional::DataStoreSpec,std::allocator<deqp::gles2::Functional::DataStoreSpec>>
                *)&name,(iterator)name._M_string_length,&local_50);
  }
  else {
    *(undefined4 *)(name._M_string_length + 8) = 0x23b;
    *(undefined8 *)name._M_string_length = 0x88e000008892;
    name._M_string_length = name._M_string_length + 0xc;
  }
  pRVar12 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
  RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
            (pRVar12,(this->super_TestCaseGroup).m_context,"different_size",
             "Recreate with different size",(DataStoreSpec *)name._M_dataplus._M_p,
             (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 2) * -0x55555555,
             VERIFY_AS_VERTEX_ARRAY);
  tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar12);
  local_38 = pTVar7;
  if (name._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(name._M_dataplus._M_p,
                    name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
  }
  deRandom_init(&rnd.m_rnd,0x5d71);
  local_1f0 = 0;
  do {
    specs = (DataStoreSpec *)operator_new(0x78);
    specs[8].target = 0;
    specs[8].usage = 0;
    *(undefined8 *)&specs[8].size = 0;
    *(undefined8 *)&specs[6].size = 0;
    specs[7].usage = 0;
    specs[7].size = 0;
    specs[5].usage = 0;
    specs[5].size = 0;
    specs[6].target = 0;
    specs[6].usage = 0;
    specs[4].target = 0;
    specs[4].usage = 0;
    *(undefined8 *)&specs[4].size = 0;
    *(undefined8 *)&specs[2].size = 0;
    specs[3].usage = 0;
    specs[3].size = 0;
    specs[1].usage = 0;
    specs[1].size = 0;
    specs[2].target = 0;
    specs[2].usage = 0;
    specs->target = 0;
    specs->usage = 0;
    *(undefined8 *)&specs->size = 0;
    specs[9].usage = 0;
    specs[9].size = 0;
    pDVar19 = specs;
    do {
      dVar5 = deRandom_getUint32(&rnd.m_rnd);
      pDVar19->target = init::bufferTargets[dVar5 & 1];
      dVar5 = deRandom_getUint32(&rnd.m_rnd);
      pDVar19->usage = init::usageHints[dVar5 % 3];
      dVar5 = deRandom_getUint32(&rnd.m_rnd);
      pDVar19->size = dVar5 % 0xfff5 + 0xc;
      pDVar19 = pDVar19 + 1;
    } while (pDVar19 != specs + 10);
    pRVar12 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    local_230 = local_220;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"random_","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
    uVar17 = (int)local_1f0 + 1;
    local_1f0 = (ulong)uVar17;
    std::ostream::operator<<(&name,uVar17);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
    std::ios_base::~ios_base(local_178);
    uVar18 = 0xf;
    if (local_230 != local_220) {
      uVar18 = local_220[0];
    }
    uVar1 = CONCAT44(uStack_204,local_208) + CONCAT44(uStack_224,local_228);
    if (uVar18 < uVar1) {
      uVar18 = 0xf;
      if (local_210 != local_200) {
        uVar18 = local_200[0];
      }
      if (uVar18 < uVar1) goto LAB_00390736;
      paiVar9 = (int (*) [2])
                std::__cxx11::string::replace((ulong)&local_210,0,(char *)0x0,(ulong)local_230);
    }
    else {
LAB_00390736:
      paiVar9 = (int (*) [2])std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_210);
    }
    local_250._0_8_ = &local_240;
    aiVar14 = (int  [2])(paiVar9 + 2);
    if (*paiVar9 == aiVar14) {
      local_240 = *(long *)aiVar14;
      aiStack_238 = paiVar9[3];
    }
    else {
      local_240 = *(long *)aiVar14;
      local_250._0_8_ = *paiVar9;
    }
    local_250._8_8_ = paiVar9[1];
    *paiVar9 = aiVar14;
    paiVar9[1] = (int  [2])0x0;
    *(undefined1 *)aiVar14 = 0;
    RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
              (pRVar12,pCVar4,(char *)local_250._0_8_,"",specs,10,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(local_38,(TestNode *)pRVar12);
    if ((long *)local_250._0_8_ != &local_240) {
      operator_delete((void *)local_250._0_8_,local_240 + 1);
    }
    if (local_210 != local_200) {
      operator_delete(local_210,local_200[0] + 1);
    }
    if (local_230 != local_220) {
      operator_delete(local_230,local_220[0] + 1);
    }
    operator_delete(specs,0x78);
    if ((int)local_1f0 == 4) {
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "basic_subdata","Basic glBufferSubData() usage");
      tcu::TestNode::addChild((TestNode *)this,pTVar7);
      lVar20 = 0;
      do {
        dVar5 = init::bufferTargets[lVar20];
        lVar16 = 0;
        local_1f0 = lVar20;
        do {
          dVar2 = *(deUint32 *)((long)init::usageHints + lVar16);
          pcVar8 = BufferTestUtil::getBufferTargetName(dVar5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_230,pcVar8,(allocator<char> *)&local_210);
          paiVar9 = (int (*) [2])std::__cxx11::string::append((char *)&local_230);
          local_250._0_8_ = &local_240;
          aiVar14 = (int  [2])(paiVar9 + 2);
          if (*paiVar9 == aiVar14) {
            local_240 = *(long *)aiVar14;
            aiStack_238 = paiVar9[3];
          }
          else {
            local_240 = *(long *)aiVar14;
            local_250._0_8_ = *paiVar9;
          }
          local_250._8_8_ = paiVar9[1];
          *paiVar9 = aiVar14;
          paiVar9[1] = (int  [2])0x0;
          *(undefined1 *)paiVar9[2] = 0;
          BufferTestUtil::getUsageHintName(dVar2);
          plVar10 = (long *)std::__cxx11::string::append(local_250);
          name._M_dataplus._M_p = (pointer)&name.field_2;
          psVar15 = (size_type *)(plVar10 + 2);
          if ((size_type *)*plVar10 == psVar15) {
            name.field_2._M_allocated_capacity = *psVar15;
            name.field_2._8_8_ = plVar10[3];
          }
          else {
            name.field_2._M_allocated_capacity = *psVar15;
            name._M_dataplus._M_p = (pointer)*plVar10;
          }
          name._M_string_length = plVar10[1];
          *plVar10 = (long)psVar15;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          if ((long *)local_250._0_8_ != &local_240) {
            operator_delete((void *)local_250._0_8_,local_240 + 1);
          }
          if (local_230 != local_220) {
            operator_delete(local_230,local_220[0] + 1);
          }
          pBVar11 = (BufferCase *)operator_new(0xd0);
          BufferTestUtil::BufferCase::BufferCase
                    (pBVar11,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,"");
          (pBVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__BufferCase_0078f1e8;
          *(deUint32 *)&pBVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
               dVar5;
          *(deUint32 *)
           ((long)&pBVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 4) =
               dVar2;
          pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x3fc;
          tcu::TestNode::addChild(pTVar7,(TestNode *)pBVar11);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)name._M_dataplus._M_p != &name.field_2) {
            operator_delete(name._M_dataplus._M_p,name.field_2._M_allocated_capacity + 1);
          }
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0xc);
        lVar20 = local_1f0 + 1;
      } while (local_1f0 == 0);
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
                 "partial_specify","Partial buffer data specification with glBufferSubData()");
      tcu::TestNode::addChild((TestNode *)this,pTVar7);
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 0;
      local_250._4_4_ = 0x3e4;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"whole_1",
                 "Whole buffer specification with single glBufferSubData()",0x8892,0x88e4,0x3e4,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 0x2d9;
      local_250._4_4_ = 999;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      local_230 = (ulong *)0x2d900000000;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_230);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"whole_2",
                 "Whole buffer specification with two calls",0x8893,0x88e8,0x6c0,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 0;
      local_250._4_4_ = 0x1a5;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      local_230 = (ulong *)0x20b0000058d;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_230);
      local_210 = (ulong *)0x3e8000001a5;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_210);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"whole_3",
                 "Whole buffer specification with three calls",0x8892,0x88e0,0x798,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 0;
      local_250._4_4_ = 500;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      local_230 = (ulong *)0xc8000001ad;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_230);
      local_210 = (ulong *)0x2af00000201;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_210);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"whole_4",
                 "Whole buffer specification with three calls",0x8893,0x88e0,0x4b0,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 0;
      local_250._4_4_ = 0x201;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"low_1",
                 "Low part of buffer specified with single call",0x8893,0x88e4,1000,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 0;
      local_250._4_4_ = 0x62;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      local_230 = (ulong *)0x1ff00000062;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_230);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"low_2",
                 "Low part of buffer specified with two calls",0x8892,0x88e4,0x3e4,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 0;
      local_250._4_4_ = 0x24f;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      local_230 = (ulong *)0x19000000173;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_230);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"low_3",
                 "Low part of buffer specified with two calls",0x8892,0x88e8,0x4b0,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 500;
      local_250._4_4_ = 500;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"high_1",
                 "High part of buffer specified with single call",0x8893,0x88e4,1000,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 600;
      local_250._4_4_ = 0x7b;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      local_230 = (ulong *)0x1dd000002d3;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_230);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"high_2",
                 "High part of buffer specified with two calls",0x8892,0x88e0,0x4b0,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 600;
      local_250._4_4_ = 200;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      local_230 = (ulong *)0x25700000259;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_230);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"high_3",
                 "High part of buffer specified with two calls",0x8892,0x88e0,0x4b0,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 1000;
      local_250._4_4_ = 799;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"middle_1",
                 "Middle part of buffer specified with single call",0x8893,0x88e0,0x9c4,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 0x30c;
      local_250._4_4_ = 0xdc;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      local_230 = (ulong *)0x1f4000003e8;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_230);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"middle_2",
                 "Middle part of buffer specified with two calls",0x8893,0x88e4,0x9c4,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      name._M_dataplus._M_p = (pointer)0x0;
      name._M_string_length = 0;
      name.field_2._M_allocated_capacity = 0;
      local_250._0_4_ = 0x30c;
      local_250._4_4_ = 0x141;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)local_250);
      local_230 = (ulong *)0x1f5000003e8;
      std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::push_back
                ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&name,
                 (value_type *)&local_230);
      pSVar13 = (SubDataToUndefinedCase *)operator_new(0xf0);
      SubDataToUndefinedCase::SubDataToUndefinedCase
                (pSVar13,(this->super_TestCaseGroup).m_context,"middle_3",
                 "Middle part of buffer specified with two calls",0x8892,0x88e8,0x9c4,
                 (IVec2 *)name._M_dataplus._M_p,
                 (int)(name._M_string_length - (long)name._M_dataplus._M_p >> 3),
                 VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar13);
      if (name._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(name._M_dataplus._M_p,
                        name.field_2._M_allocated_capacity - (long)name._M_dataplus._M_p);
      }
      pTVar7 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar7,
                 (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
                 "Randomized buffer data cases");
      tcu::TestNode::addChild((TestNode *)this,pTVar7);
      uVar17 = 0;
      do {
        pBVar11 = (BufferCase *)operator_new(0x110);
        pCVar4 = (this->super_TestCaseGroup).m_context;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&name);
        std::ostream::operator<<(&name,uVar17);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
        std::ios_base::~ios_base(local_178);
        BufferTestUtil::BufferCase::BufferCase(pBVar11,pCVar4,(char *)local_250._0_8_,"");
        uVar6 = (uVar17 >> 0x10 ^ uVar17 ^ 0x3d) * 9;
        uVar6 = (uVar6 >> 4 ^ uVar6) * 0x27d4eb2d;
        (pBVar11->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
             (_func_int **)&PTR__RandomBufferWriteCase_0078f2d8;
        *(uint *)&pBVar11[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
             uVar6 >> 0xf ^ uVar6;
        pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
        *(undefined4 *)
         &pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p = 0;
        pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_name._M_string_length = 0;
        pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2._M_allocated_capacity
             = 0;
        *(undefined8 *)
         ((long)&pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
        pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_dataplus._M_p =
             (pointer)0x0;
        pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_description._M_string_length = 0;
        pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2.
        _M_allocated_capacity = 0;
        *(undefined8 *)
         ((long)&pBVar11[1].super_TestCase.super_TestCase.super_TestNode.m_description.field_2 + 8)
             = 0;
        tcu::TestNode::addChild(pTVar7,(TestNode *)pBVar11);
        aiVar14 = (int  [2])&local_240;
        if ((int  [2])local_250._0_8_ != aiVar14) {
          operator_delete((void *)local_250._0_8_,local_240 + 1);
          aiVar14 = extraout_RAX;
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != 10);
      return aiVar14[0];
    }
  } while( true );
}

Assistant:

void BufferWriteTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER
	};

	static const deUint32 usageHints[] =
	{
		GL_STREAM_DRAW,
		GL_STATIC_DRAW,
		GL_DYNAMIC_DRAW
	};

	static const struct
	{
		const char*	name;
		VerifyType	verify;
	} verifyTypes[] =
	{
		{ "vertex_array",	VERIFY_AS_VERTEX_ARRAY	},
		{ "index_array",	VERIFY_AS_INDEX_ARRAY	}
	};

	// .basic
	{
		tcu::TestCaseGroup* const basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic upload with glBufferData()");
		addChild(basicGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
		{
			for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageHints); usageNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= usageHints[usageNdx];
				const int			size	= 1020;
				const VerifyType	verify	= VERIFY_AS_VERTEX_ARRAY;
				const string		name	= string(getBufferTargetName(target)) + "_" + getUsageHintName(usage);

				basicGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .use
	{
		tcu::TestCaseGroup* const useGroup = new tcu::TestCaseGroup(m_testCtx, "use", "Buffer uses");
		addChild(useGroup);

		for (int verifyNdx = 0; verifyNdx < DE_LENGTH_OF_ARRAY(verifyTypes); verifyNdx++)
		{
			tcu::TestCaseGroup* const verifyGroup = new tcu::TestCaseGroup(m_testCtx, verifyTypes[verifyNdx].name, "");
			useGroup->addChild(verifyGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= GL_STATIC_DRAW;
				const int			size	= 763;
				const VerifyType	verify	= verifyTypes[verifyNdx].verify;
				const string		name	= getBufferTargetName(target);

				verifyGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .recreate_store
	{
		tcu::TestCaseGroup* const recreateStoreGroup = new tcu::TestCaseGroup(m_testCtx, "recreate_store", "Data store recreate using glBufferData()");
		addChild(recreateStoreGroup);

#define RECREATE_STORE_CASE(NAME, DESC, SPECLIST)																											\
		do {																																				\
			std::vector<DataStoreSpec> specs;																												\
			DataStoreSpecVecBuilder builder(specs);																											\
			builder SPECLIST;																																\
			recreateStoreGroup->addChild(new RecreateBufferDataStoreCase(m_context, #NAME, DESC, &specs[0], (int)specs.size(), VERIFY_AS_VERTEX_ARRAY));	\
		} while (deGetFalse())

		RECREATE_STORE_CASE(identical_1, "Recreate with identical parameters",
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996));

		RECREATE_STORE_CASE(identical_2, "Recreate with identical parameters",
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 72)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 72)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 72));

		RECREATE_STORE_CASE(different_target_1, "Recreate with different target",
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER,		GL_STATIC_DRAW, 504));

		RECREATE_STORE_CASE(different_target_2, "Recreate with different target",
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER,		GL_STATIC_DRAW, 716)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW, 716)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER,		GL_STATIC_DRAW, 716));

		RECREATE_STORE_CASE(different_usage, "Recreate with different usage",
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_DYNAMIC_DRAW,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	1644));

		RECREATE_STORE_CASE(different_size, "Recreate with different size",
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	1024)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	12)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	3327)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	92)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	12379)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	571));

#undef RECREATE_STORE_CASE

		// Random cases.
		{
			const int			numRandomCases		= 4;
			const int			numUploadsPerCase	= 10;
			const int			minSize				= 12;
			const int			maxSize				= 65536;
			const VerifyType	verify				= VERIFY_AS_VERTEX_ARRAY;
			de::Random			rnd					(23921);

			for (int caseNdx = 0; caseNdx < numRandomCases; caseNdx++)
			{
				vector<DataStoreSpec> specs(numUploadsPerCase);

				for (vector<DataStoreSpec>::iterator spec = specs.begin(); spec != specs.end(); spec++)
				{
					spec->target	= bufferTargets[rnd.getInt(0, DE_LENGTH_OF_ARRAY(bufferTargets)-1)];
					spec->usage		= usageHints[rnd.getInt(0, DE_LENGTH_OF_ARRAY(usageHints)-1)];
					spec->size		= rnd.getInt(minSize, maxSize);
				}

				recreateStoreGroup->addChild(new RecreateBufferDataStoreCase(m_context, (string("random_") + de::toString(caseNdx+1)).c_str(), "", &specs[0], (int)specs.size(), verify));
			}
		}
	}

	// .basic_subdata
	{
		tcu::TestCaseGroup* const basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic_subdata", "Basic glBufferSubData() usage");
		addChild(basicGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
		{
			for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageHints); usageNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= usageHints[usageNdx];
				const int			size	= 1020;
				const VerifyType	verify	= VERIFY_AS_VERTEX_ARRAY;
				const string		name	= string(getBufferTargetName(target)) + "_" + getUsageHintName(usage);

				basicGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .partial_specify
	{
		tcu::TestCaseGroup* const partialSpecifyGroup = new tcu::TestCaseGroup(m_testCtx, "partial_specify", "Partial buffer data specification with glBufferSubData()");
		addChild(partialSpecifyGroup);

#define PARTIAL_SPECIFY_CASE(NAME, DESC, TARGET, USAGE, SIZE, RANGELIST)																									\
		do {																																								\
			std::vector<tcu::IVec2> ranges;																																	\
			RangeVecBuilder builder(ranges);																																\
			builder RANGELIST;																																				\
			partialSpecifyGroup->addChild(new SubDataToUndefinedCase(m_context, #NAME, DESC, TARGET, USAGE, SIZE, &ranges[0], (int)ranges.size(), VERIFY_AS_VERTEX_ARRAY));	\
		} while (deGetFalse())

		PARTIAL_SPECIFY_CASE(whole_1, "Whole buffer specification with single glBufferSubData()", GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996,
			<< IVec2(0, 996));
		PARTIAL_SPECIFY_CASE(whole_2, "Whole buffer specification with two calls", GL_ELEMENT_ARRAY_BUFFER, GL_DYNAMIC_DRAW, 1728,
			<< IVec2(729, 999)
			<< IVec2(0, 729));
		PARTIAL_SPECIFY_CASE(whole_3, "Whole buffer specification with three calls", GL_ARRAY_BUFFER, GL_STREAM_DRAW, 1944,
			<< IVec2(0, 421)
			<< IVec2(1421, 523)
			<< IVec2(421, 1000));
		PARTIAL_SPECIFY_CASE(whole_4, "Whole buffer specification with three calls", GL_ELEMENT_ARRAY_BUFFER, GL_STREAM_DRAW, 1200,
			<< IVec2(0, 500)
			<< IVec2(429, 200)
			<< IVec2(513, 687));

		PARTIAL_SPECIFY_CASE(low_1, "Low part of buffer specified with single call", GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 1000,
			<< IVec2(0, 513));
		PARTIAL_SPECIFY_CASE(low_2, "Low part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996,
			<< IVec2(0, 98)
			<< IVec2(98, 511));
		PARTIAL_SPECIFY_CASE(low_3, "Low part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_DYNAMIC_DRAW, 1200,
			<< IVec2(0, 591)
			<< IVec2(371, 400));

		PARTIAL_SPECIFY_CASE(high_1, "High part of buffer specified with single call", GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 1000,
			<< IVec2(500, 500));
		PARTIAL_SPECIFY_CASE(high_2, "High part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_STREAM_DRAW, 1200,
			<< IVec2(600, 123)
			<< IVec2(723, 477));
		PARTIAL_SPECIFY_CASE(high_3, "High part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_STREAM_DRAW, 1200,
			<< IVec2(600, 200)
			<< IVec2(601, 599));

		PARTIAL_SPECIFY_CASE(middle_1, "Middle part of buffer specified with single call", GL_ELEMENT_ARRAY_BUFFER, GL_STREAM_DRAW, 2500,
			<< IVec2(1000, 799));
		PARTIAL_SPECIFY_CASE(middle_2, "Middle part of buffer specified with two calls", GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 2500,
			<< IVec2(780, 220)
			<< IVec2(1000, 500));
		PARTIAL_SPECIFY_CASE(middle_3, "Middle part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_DYNAMIC_DRAW, 2500,
			<< IVec2(780, 321)
			<< IVec2(1000, 501));

#undef PARTIAL_SPECIFY_CASE
	}

	// .random
	{
		tcu::TestCaseGroup* const randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized buffer data cases");
		addChild(randomGroup);

		for (int i = 0; i < 10; i++)
			randomGroup->addChild(new RandomBufferWriteCase(m_context, de::toString(i).c_str(), "", deInt32Hash(i)));
	}
}